

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad_av1.c
# Opt level: O2

uint highbd_masked_sad(uint8_t *src8,int src_stride,uint8_t *a8,int a_stride,uint8_t *b8,
                      int b_stride,uint8_t *m,int m_stride,int width,int height)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  lVar4 = (long)src8 * 2;
  lVar2 = (long)a8 * 2;
  lVar5 = (long)b8 * 2;
  uVar9 = 0;
  uVar8 = (ulong)(uint)width;
  if (width < 1) {
    uVar8 = uVar9;
  }
  if (height < 1) {
    height = 0;
  }
  uVar1 = 0;
  for (; (int)uVar9 != height; uVar9 = (ulong)((int)uVar9 + 1)) {
    for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
      iVar6 = ((uint)*(ushort *)(lVar2 + uVar7 * 2) * (uint)m[uVar7] +
               (uint)*(ushort *)(lVar5 + uVar7 * 2) * (0x40 - (uint)m[uVar7]) + 0x20 >> 6 & 0xffff)
              - (uint)*(ushort *)(lVar4 + uVar7 * 2);
      iVar3 = -iVar6;
      if (0 < iVar6) {
        iVar3 = iVar6;
      }
      uVar1 = uVar1 + iVar3;
    }
    m = m + m_stride;
    lVar4 = lVar4 + (long)src_stride * 2;
    lVar5 = lVar5 + (long)b_stride * 2;
    lVar2 = lVar2 + (long)a_stride * 2;
  }
  return uVar1;
}

Assistant:

static inline unsigned int highbd_masked_sad(
                            const uint8_t *src8, int src_stride,
                            const uint8_t *a8, int a_stride, const uint8_t *b8,
                            int b_stride, const uint8_t *m, int m_stride,
                            int width, int height) {
  int y, x;
  unsigned int sad = 0;
  const uint16_t *src = CONVERT_TO_SHORTPTR(src8);
  const uint16_t *a = CONVERT_TO_SHORTPTR(a8);
  const uint16_t *b = CONVERT_TO_SHORTPTR(b8);

  for (y = 0; y < height; y++) {
    for (x = 0; x < width; x++) {
      const uint16_t pred = AOM_BLEND_A64(m[x], a[x], b[x]);
      sad += abs(pred - src[x]);
    }

    src += src_stride;
    a += a_stride;
    b += b_stride;
    m += m_stride;
  }

  return sad;
}